

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O2

void ResizeCountNodePages(void)

{
  size_t __size;
  ulong uVar1;
  int **ppiVar2;
  int iVar3;
  int **__ptr;
  ulong uVar4;
  int **ppiVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  iVar3 = page;
  lVar7 = (long)page;
  uVar1 = lVar7 + 1;
  iVar8 = (int)uVar1;
  __ptr = nodePages;
  page = iVar8;
  if (iVar8 == maxPages) {
    __size = lVar7 * 8 + 0x408;
    __ptr = (int **)malloc(__size);
    ppiVar2 = nodePages;
    if (__ptr == (int **)0x0) {
      for (lVar9 = 0; lVar9 <= lVar7; lVar9 = lVar9 + 1) {
        if (ppiVar2[lVar9] != (int *)0x0) {
          free(ppiVar2[lVar9]);
          ppiVar2[lVar9] = (int *)0x0;
        }
      }
      if (ppiVar2 != (int **)0x0) {
        free(ppiVar2);
        nodePages = (int **)0x0;
      }
      ppiVar2 = lightNodePages;
      for (lVar9 = 0; lVar9 <= lVar7; lVar9 = lVar9 + 1) {
        if (ppiVar2[lVar9] != (int *)0x0) {
          free(ppiVar2[lVar9]);
          ppiVar2[lVar9] = (int *)0x0;
        }
      }
      goto joined_r0x0074fa6f;
    }
    uVar4 = 0;
    uVar6 = 0;
    if (0 < iVar8) {
      uVar6 = uVar1 & 0xffffffff;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      __ptr[uVar4] = ppiVar2[uVar4];
    }
    free(ppiVar2);
    nodePages = __ptr;
    ppiVar5 = (int **)malloc(__size);
    ppiVar2 = lightNodePages;
    if (ppiVar5 == (int **)0x0) {
      for (lVar9 = 0; lVar9 <= lVar7; lVar9 = lVar9 + 1) {
        if (__ptr[lVar9] != (int *)0x0) {
          free(__ptr[lVar9]);
          __ptr[lVar9] = (int *)0x0;
        }
      }
      free(__ptr);
      ppiVar2 = lightNodePages;
      nodePages = (int **)0x0;
      for (lVar9 = 0; lVar9 <= lVar7; lVar9 = lVar9 + 1) {
        if (ppiVar2[lVar9] != (int *)0x0) {
          free(ppiVar2[lVar9]);
          ppiVar2[lVar9] = (int *)0x0;
        }
      }
      goto joined_r0x0074fa6f;
    }
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      ppiVar5[uVar4] = ppiVar2[uVar4];
    }
    free(ppiVar2);
    lightNodePages = ppiVar5;
    maxPages = iVar3 + 0x81;
  }
  currentNodePage = (int *)malloc(0x2000);
  __ptr[lVar7 + 1] = currentNodePage;
  if (currentNodePage == (int *)0x0) {
    for (lVar9 = 0; lVar9 <= lVar7; lVar9 = lVar9 + 1) {
      if (__ptr[lVar9] != (int *)0x0) {
        free(__ptr[lVar9]);
        __ptr[lVar9] = (int *)0x0;
      }
    }
    free(__ptr);
    ppiVar2 = lightNodePages;
    nodePages = (int **)0x0;
    for (lVar9 = 0; lVar9 <= lVar7; lVar9 = lVar9 + 1) {
      if (ppiVar2[lVar9] != (int *)0x0) {
        free(ppiVar2[lVar9]);
        ppiVar2[lVar9] = (int *)0x0;
      }
    }
  }
  else {
    currentLightNodePage = (int *)malloc(0x2000);
    ppiVar2 = lightNodePages;
    lightNodePages[lVar7 + 1] = currentLightNodePage;
    if (currentLightNodePage != (int *)0x0) {
      pageIndex = 0;
      return;
    }
    currentLightNodePage = (int *)0x0;
    for (lVar9 = 0; lVar9 <= (long)uVar1; lVar9 = lVar9 + 1) {
      if (__ptr[lVar9] != (int *)0x0) {
        free(__ptr[lVar9]);
        __ptr[lVar9] = (int *)0x0;
      }
    }
    free(__ptr);
    nodePages = (int **)0x0;
    for (lVar9 = 0; lVar9 <= lVar7; lVar9 = lVar9 + 1) {
      if (ppiVar2[lVar9] != (int *)0x0) {
        free(ppiVar2[lVar9]);
        ppiVar2[lVar9] = (int *)0x0;
      }
    }
  }
joined_r0x0074fa6f:
  if (ppiVar2 != (int **)0x0) {
    free(ppiVar2);
    lightNodePages = (int **)0x0;
  }
  memOut = 1;
  return;
}

Assistant:

static void
ResizeCountNodePages(void)
{
    int i;
    int **newNodePages;

    page++;

    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. The number of pages is incremented
     * by INITIAL_PAGES.
     */
    if (page == maxPages) {
        newNodePages = ABC_ALLOC(int *,maxPages + INITIAL_PAGES);
        if (newNodePages == NULL) {
            for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
            ABC_FREE(nodePages);
            for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
            ABC_FREE(lightNodePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxPages; i++) {
                newNodePages[i] = nodePages[i];
            }
            ABC_FREE(nodePages);
            nodePages = newNodePages;
        }

        newNodePages = ABC_ALLOC(int *,maxPages + INITIAL_PAGES);
        if (newNodePages == NULL) {
            for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
            ABC_FREE(nodePages);
            for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
            ABC_FREE(lightNodePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxPages; i++) {
                newNodePages[i] = lightNodePages[i];
            }
            ABC_FREE(lightNodePages);
            lightNodePages = newNodePages;
        }
        /* Increase total page count */
        maxPages += INITIAL_PAGES;
    }
    /* Allocate a new page */
    currentNodePage = nodePages[page] = ABC_ALLOC(int,pageSize);
    if (currentNodePage == NULL) {
        for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
        ABC_FREE(nodePages);
        for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
        ABC_FREE(lightNodePages);
        memOut = 1;
        return;
    }
    /* Allocate a new page */
    currentLightNodePage = lightNodePages[page] = ABC_ALLOC(int,pageSize);
    if (currentLightNodePage == NULL) {
        for (i = 0; i <= page; i++) ABC_FREE(nodePages[i]);
        ABC_FREE(nodePages);
        for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
        ABC_FREE(lightNodePages);
        memOut = 1;
        return;
    }
    /* reset page index */
    pageIndex = 0;
    return;

}